

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O1

Gia_Man_t * Acec_CommonStart(Gia_Man_t *pBase,Gia_Man_t *pAdd)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  Gia_Obj_t *pGVar6;
  char *pcVar7;
  int iVar8;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  Gia_Obj_t *pGVar15;
  long lVar16;
  long lVar17;
  
  Gia_ManFillValue(pAdd);
  pGVar4 = pAdd->pObjs;
  pGVar4->Value = 0;
  if (pBase == (Gia_Man_t *)0x0) {
    pBase = Gia_ManStart(pAdd->nObjs);
    pcVar7 = pAdd->pName;
    if (pcVar7 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      sVar9 = strlen(pcVar7);
      pcVar10 = (char *)malloc(sVar9 + 1);
      strcpy(pcVar10,pcVar7);
    }
    pBase->pName = pcVar10;
    pcVar7 = pAdd->pSpec;
    if (pcVar7 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      sVar9 = strlen(pcVar7);
      pcVar10 = (char *)malloc(sVar9 + 1);
      strcpy(pcVar10,pcVar7);
    }
    pBase->pSpec = pcVar10;
    pVVar11 = pAdd->vCis;
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        iVar8 = pVVar11->pArray[lVar16];
        if (((long)iVar8 < 0) || (pAdd->nObjs <= iVar8)) goto LAB_00660121;
        pGVar4 = pAdd->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        pGVar15 = Gia_ManAppendObj(pBase);
        uVar12 = *(ulong *)pGVar15;
        *(ulong *)pGVar15 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar15 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pBase->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar6 = pBase->pObjs;
        if ((pGVar15 < pGVar6) || (pGVar6 + pBase->nObjs <= pGVar15)) goto LAB_00660140;
        Vec_IntPush(pBase->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * -0x55555555);
        pGVar6 = pBase->pObjs;
        if ((pGVar15 < pGVar6) || (pGVar6 + pBase->nObjs <= pGVar15)) goto LAB_00660140;
        pGVar4[iVar8].Value = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        pVVar11 = pAdd->vCis;
      } while (lVar16 < pVVar11->nSize);
    }
    Gia_ManHashAlloc(pBase);
  }
  else {
    pVVar11 = pBase->vCis;
    uVar1 = pVVar11->nSize;
    uVar2 = pAdd->vCis->nSize;
    if (uVar1 != uVar2) {
      __assert_fail("Gia_ManCiNum(pBase) == Gia_ManCiNum(pAdd)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCore.c"
                    ,0xa5,"Gia_Man_t *Acec_CommonStart(Gia_Man_t *, Gia_Man_t *)");
    }
    if (0 < (int)uVar2) {
      piVar5 = pAdd->vCis->pArray;
      uVar13 = 0;
      uVar12 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar12 = uVar13;
      }
LAB_0065fe38:
      iVar8 = piVar5[uVar13];
      if (((long)iVar8 < 0) || (pAdd->nObjs <= iVar8)) {
LAB_00660121:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGVar4 != (Gia_Obj_t *)0x0) {
        if (uVar12 == uVar13) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar3 = pVVar11->pArray[uVar13];
        if (((long)iVar3 < 0) || (pBase->nObjs <= iVar3)) goto LAB_00660121;
        pGVar6 = pBase->pObjs;
        pGVar15 = (Gia_Obj_t *)((ulong)(pGVar6 + iVar3) & 0xfffffffffffffffe);
        if ((pGVar15 < pGVar6) || (pGVar6 + pBase->nObjs <= pGVar15)) {
LAB_00660140:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar14 = (int)((ulong)((long)pGVar15 - (long)pGVar6) >> 2);
        if (iVar14 * -0x55555555 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        pGVar4[iVar8].Value = ((uint)(pGVar6 + iVar3) & 1) + iVar14 * 0x55555556;
        uVar13 = uVar13 + 1;
        if (uVar2 != uVar13) goto LAB_0065fe38;
      }
    }
  }
  if (0 < pAdd->nObjs) {
    lVar17 = 8;
    lVar16 = 0;
    do {
      pGVar4 = pAdd->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        return pBase;
      }
      uVar12 = *(ulong *)((long)pGVar4 + lVar17 + -8);
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        uVar1 = *(uint *)((long)pGVar4 +
                         lVar17 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar2 = *(uint *)((long)pGVar4 +
                             lVar17 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar2 < 0)) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        iVar8 = Gia_ManHashAnd(pBase,uVar1 ^ (uint)(uVar12 >> 0x1d) & 1,
                               uVar2 ^ (uint)(uVar12 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar17) = iVar8;
      }
      lVar16 = lVar16 + 1;
      lVar17 = lVar17 + 0xc;
    } while (lVar16 < pAdd->nObjs);
  }
  return pBase;
}

Assistant:

Gia_Man_t * Acec_CommonStart( Gia_Man_t * pBase, Gia_Man_t * pAdd )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( pAdd );
    Gia_ManConst0(pAdd)->Value = 0;
    if ( pBase == NULL )
    {
        pBase = Gia_ManStart( Gia_ManObjNum(pAdd) );
        pBase->pName = Abc_UtilStrsav( pAdd->pName );
        pBase->pSpec = Abc_UtilStrsav( pAdd->pSpec );
        Gia_ManForEachCi( pAdd, pObj, i )
            pObj->Value = Gia_ManAppendCi(pBase);
        Gia_ManHashAlloc( pBase );
    }
    else
    {
        assert( Gia_ManCiNum(pBase) == Gia_ManCiNum(pAdd) );
        Gia_ManForEachCi( pAdd, pObj, i )
            pObj->Value = Gia_Obj2Lit( pBase, Gia_ManCi(pBase, i) );
    }
    Gia_ManForEachAnd( pAdd, pObj, i )
        pObj->Value = Gia_ManHashAnd( pBase, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    return pBase;
}